

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fff) == 0x7c00) {
    return (Float<unsigned_long,_11,_52,_1023,_3U>)
           (((ulong)(-1 < (short)uVar1) << 0x3f) + 0xfff0000000000000);
  }
  uVar4 = uVar1 & 0x3ff;
  if ((uVar1 & 0x7c00) == 0x7c00 && uVar4 != 0) {
    return (Float<unsigned_long,_11,_52,_1023,_3U>)0x7fffffffffffffff;
  }
  if ((uVar1 & 0x7fff) != 0) {
    bVar6 = uVar4 != 0;
    bVar7 = (uVar1 & 0x7c00) == 0;
    iVar3 = -0xe;
    if (!bVar7 || !bVar6) {
      iVar3 = (uVar1 >> 10 & 0x1f) - 0xf;
    }
    if (!bVar7 || !bVar6) {
      uVar4 = uVar4 + 0x400;
    }
    uVar5 = (uint)uVar4;
    if (bVar7 && bVar6) {
      lVar2 = 0x3f;
      if ((uVar4 & 0x3ff) != 0) {
        for (; (uVar4 & 0x3ff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = (uint)uVar4 << (~(byte)lVar2 + 0xb & 0x3f);
      iVar3 = (iVar3 - ((uint)lVar2 ^ 0x3f)) + 0x35;
    }
    return (Float<unsigned_long,_11,_52,_1023,_3U>)
           ((ulong)(iVar3 + 0x3ff) << 0x34 | (ulong)(uVar1 & 0x8000) << 0x30 |
           (ulong)(uVar5 & 0x1ffbff) << 0x2a);
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)((ulong)uVar1 << 0x30);
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}